

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void bothImplyNotNullRow(Walker *pWalker,Expr *pE1,Expr *pE2)

{
  Expr *in_RDX;
  Walker *in_RSI;
  long in_RDI;
  
  if ((*(short *)(in_RDI + 0x24) == 0) &&
     (sqlite3WalkExpr(in_RSI,in_RDX), *(short *)(in_RDI + 0x24) != 0)) {
    *(undefined2 *)(in_RDI + 0x24) = 0;
    sqlite3WalkExpr(in_RSI,in_RDX);
  }
  return;
}

Assistant:

static void bothImplyNotNullRow(Walker *pWalker, Expr *pE1, Expr *pE2){
  if( pWalker->eCode==0 ){
    sqlite3WalkExpr(pWalker, pE1);
    if( pWalker->eCode ){
      pWalker->eCode = 0;
      sqlite3WalkExpr(pWalker, pE2);
    }
  }
}